

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRT_builder_main.cpp
# Opt level: O3

CProgram * parseCodeWithLex(string *testfile_name)

{
  CProgram *in_RAX;
  ostream *poVar1;
  CProgram *cProgram;
  CProgram *local_18;
  
  line_number = 1;
  column_number = 1;
  local_18 = in_RAX;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Processing: ",0xc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(testfile_name->_M_dataplus)._M_p,testfile_name->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  yyin = (FILE *)fopen((testfile_name->_M_dataplus)._M_p,"r");
  yyrestart(yyin);
  yyparse(&local_18);
  fclose((FILE *)yyin);
  return local_18;
}

Assistant:

CProgram *parseCodeWithLex( const std::string &testfile_name ) {
    CProgram *cProgram;
    line_number = 1;
    column_number = 1;
    std::cout << std::endl << "Processing: " << testfile_name << std::endl;
    yyin = fopen( testfile_name.c_str( ), "r" );
    yyrestart( yyin );
    yyparse( &cProgram );
    fclose( yyin );

    return cProgram;
}